

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash_test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b780::Binary_PutUvarint_Test::TestBody(Binary_PutUvarint_Test *this)

{
  allocator<unsigned_char> *paVar1;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  bool bVar2;
  char *pcVar3;
  AssertHelper local_2c8;
  Message local_2c0 [2];
  out_of_range *anon_var_0;
  char *pcStack_2a8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertHelper local_290;
  Message local_288;
  int local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_5;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_4;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_240;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_238;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_230;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_228;
  allocator<unsigned_char> local_20c;
  uchar local_20b [3];
  iterator local_208;
  size_type local_200;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1f8;
  AssertHelper local_1e0;
  Message local_1d8;
  int local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_3;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_190;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_188;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_180;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_178;
  allocator<unsigned_char> local_15b;
  uchar local_15a [2];
  iterator local_158;
  size_type local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  AssertHelper local_130;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_1;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  allocator<unsigned_char> local_aa;
  uchar local_a9;
  iterator local_a8;
  size_type local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  int local_6c;
  undefined1 auStack_68 [4];
  int count;
  Bytes actual;
  undefined1 auStack_48 [8];
  Bytes expect;
  undefined1 auStack_28 [8];
  Bytes buf;
  Binary_PutUvarint_Test *this_local;
  
  auStack_28 = (undefined1  [8])0x0;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  auStack_48 = (undefined1  [8])0x0;
  expect.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  expect.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_48);
  _auStack_68 = (pointer)0x0;
  actual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  actual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_68);
  local_6c = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28,10);
  local_a9 = '\x01';
  local_a8 = &local_a9;
  local_a0 = 1;
  std::allocator<unsigned_char>::allocator(&local_aa);
  __l_01._M_len = local_a0;
  __l_01._M_array = local_a8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_98,__l_01,&local_aa);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_48,&local_98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_98);
  std::allocator<unsigned_char>::~allocator(&local_aa);
  local_6c = binary::putUvarint((Bytes *)auStack_28,1);
  local_d0._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  local_e0._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  local_d8 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_e0,(long)local_6c);
  paVar1 = (allocator<unsigned_char> *)((long)&gtest_ar.message_.ptr_ + 7);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c8,local_d0,local_d8,
             paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_68,&local_c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_c8);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&gtest_ar.message_.ptr_ + 7));
  testing::internal::EqHelper<false>::
  Compare<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((EqHelper<false> *)local_f8,"expect","actual",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_48,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_68);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar2) {
    testing::Message::Message(&local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x5e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  local_11c = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_118,"1","count",&local_11c,&local_6c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar2) {
    testing::Message::Message(&local_128);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x5f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28,10);
  local_15a[0] = 0x80;
  local_15a[1] = 1;
  local_158 = local_15a;
  local_150 = 2;
  std::allocator<unsigned_char>::allocator(&local_15b);
  __l_00._M_len = local_150;
  __l_00._M_array = local_158;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_148,__l_00,&local_15b);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_48,&local_148);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_148);
  std::allocator<unsigned_char>::~allocator(&local_15b);
  local_6c = binary::putUvarint((Bytes *)auStack_28,0x80);
  local_180._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  local_190._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  local_188 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_190,(long)local_6c);
  paVar1 = (allocator<unsigned_char> *)((long)&gtest_ar_2.message_.ptr_ + 7);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_178,local_180,local_188,
             paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_68,&local_178);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_178);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  testing::internal::EqHelper<false>::
  Compare<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((EqHelper<false> *)local_1a8,"expect","actual",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_48,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_68);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar2) {
    testing::Message::Message(&local_1b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x67,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  local_1cc = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_1c8,"2","count",&local_1cc,&local_6c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar2) {
    testing::Message::Message(&local_1d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x68,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28,10);
  local_20b[0] = 0x80;
  local_20b[1] = 0x80;
  local_20b[2] = 1;
  local_208 = local_20b;
  local_200 = 3;
  std::allocator<unsigned_char>::allocator(&local_20c);
  __l._M_len = local_200;
  __l._M_array = local_208;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_1f8,__l,&local_20c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_48,&local_1f8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1f8);
  std::allocator<unsigned_char>::~allocator(&local_20c);
  local_6c = binary::putUvarint((Bytes *)auStack_28,0x4000);
  local_230._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  local_240._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  local_238 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_240,(long)local_6c);
  paVar1 = (allocator<unsigned_char> *)((long)&gtest_ar_4.message_.ptr_ + 7);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_228,local_230,local_238,
             paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_68,&local_228);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_228);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&gtest_ar_4.message_.ptr_ + 7));
  testing::internal::EqHelper<false>::
  Compare<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((EqHelper<false> *)local_258,"expect","actual",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_48,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_68);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar2) {
    testing::Message::Message(&local_260);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  local_27c = 3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_278,"3","count",&local_27c,&local_6c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar2) {
    testing::Message::Message(&local_288);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x71,pcVar3);
    testing::internal::AssertHelper::operator=(&local_290,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  std::initializer_list<unsigned_char>::initializer_list
            ((initializer_list<unsigned_char> *)&gtest_msg);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28,_gtest_msg);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffd58,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffd58);
  if (bVar2) {
    anon_var_0._7_1_ = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      binary::putUvarint((Bytes *)auStack_28,0x7b);
    }
    if ((anon_var_0._7_1_ & 1) != 0) {
      anon_var_0._0_4_ = 0;
      goto LAB_00110699;
    }
    pcStack_2a8 = 
    "Expected: binary::putUvarint(buf, 123) throws an exception of type std::out_of_range.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_2c0);
  testing::internal::AssertHelper::AssertHelper
            (&local_2c8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
             ,0x75,pcStack_2a8);
  testing::internal::AssertHelper::operator=(&local_2c8,local_2c0);
  testing::internal::AssertHelper::~AssertHelper(&local_2c8);
  testing::Message::~Message(local_2c0);
  anon_var_0._0_4_ = 1;
LAB_00110699:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  return;
}

Assistant:

TEST(Binary, PutUvarint) {
	multihash::Bytes buf{};
	multihash::Bytes expect{};
	multihash::Bytes actual{};
	int count{};

	// write simple byte
	buf.clear();
	buf.resize(binary::MaxVarintLen64);
	expect = multihash::Bytes{1};
	count = binary::putUvarint(buf, 0b00000001);
	actual = multihash::Bytes{buf.begin(), buf.begin() + count};
	EXPECT_EQ(expect, actual);
	EXPECT_EQ(1, count);

	// write value that requires two bytes
	buf.clear();
	buf.resize(binary::MaxVarintLen64);
	expect = multihash::Bytes{0b10000000, 0b00000001};
	count = binary::putUvarint(buf, 128);
	actual = multihash::Bytes{buf.begin(), buf.begin() + count};
	EXPECT_EQ(expect, actual);
	EXPECT_EQ(2, count);

	// write value that requires three bytes
	buf.clear();
	buf.resize(binary::MaxVarintLen64);
	expect = multihash::Bytes{0b10000000, 0b10000000, 0b00000001};
	count = binary::putUvarint(buf, 16384);
	actual = multihash::Bytes{buf.begin(), buf.begin() + count};
	EXPECT_EQ(expect, actual);
	EXPECT_EQ(3, count);

	// empty buffer
	buf = {};
	ASSERT_THROW(binary::putUvarint(buf, 123), std::out_of_range);
}